

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

int dedotdotify(char *input,size_t clen,char **outp)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  byte *pbVar10;
  
  *outp = (char *)0x0;
  pvVar5 = memchr(input,0x2e,clen);
  if (pvVar5 == (void *)0x0) {
    return 0;
  }
  pcVar6 = (char *)(*Curl_cmalloc)(clen + 1);
  if (pcVar6 == (char *)0x0) {
    return 1;
  }
  pbVar10 = (byte *)(input + clen);
  *pcVar6 = '\0';
  pcVar9 = pcVar6;
  do {
    bVar2 = *input;
    uVar8 = (ulong)bVar2;
    if (bVar2 == 0x2f) {
      if (((byte *)input)[1] - 0x2e == 0) {
        iVar3 = 0x2f - (uint)((byte *)input)[2];
      }
      else {
        iVar3 = -(((byte *)input)[1] - 0x2e);
      }
      if (iVar3 == 0) {
LAB_00163a0f:
        input = (char *)((byte *)input + 2);
      }
      else {
        uVar4 = ((byte *)input)[1] - 0x2e;
        if (uVar4 == 0) {
          uVar4 = (uint)((byte *)input)[2];
        }
        if (uVar4 == 0) goto LAB_00163b35;
        if (((byte *)input)[1] - 0x2e == 0) {
          iVar3 = 0x3f - (uint)((byte *)input)[2];
        }
        else {
          iVar3 = -(((byte *)input)[1] - 0x2e);
        }
        if (iVar3 == 0) goto LAB_00163b35;
        iVar3 = strncmp("/../",input,4);
        if (iVar3 != 0) {
          iVar3 = strcmp("/..",input);
          if ((iVar3 != 0) && (iVar3 = strncmp("/..?",input,4), iVar3 != 0)) goto LAB_00163aea;
          goto LAB_00163b2d;
        }
        input = (char *)((byte *)input + 3);
        pcVar7 = pcVar9;
        do {
          pcVar9 = pcVar7;
          if (pcVar7 <= pcVar6) break;
          pcVar9 = pcVar7 + -1;
          pcVar1 = pcVar7 + -1;
          pcVar7 = pcVar9;
        } while (*pcVar1 != '/');
        *pcVar9 = '\0';
      }
    }
    else {
      if (bVar2 == 0x2e) {
        if (((byte *)input)[1] == 0x2f) goto LAB_00163a0f;
        if (((byte *)input)[1] - 0x2e == 0) {
          iVar3 = 0x2f - (uint)((byte *)input)[2];
        }
        else {
          iVar3 = -(((byte *)input)[1] - 0x2e);
        }
        if (iVar3 == 0) {
          input = (char *)((byte *)input + 3);
          goto LAB_00163b09;
        }
        pcVar7 = pcVar6;
        if (((byte *)input)[1] == 0) goto LAB_00163b47;
        uVar4 = ((byte *)input)[1] - 0x2e;
        if (uVar4 == 0) {
          uVar4 = (uint)((byte *)input)[2];
        }
        if ((uVar4 == 0) || (((byte *)input)[1] == 0x3f)) goto LAB_00163b47;
        if (((byte *)input)[1] - 0x2e == 0) {
          iVar3 = 0x3f - (uint)((byte *)input)[2];
        }
        else {
          iVar3 = -(((byte *)input)[1] - 0x2e);
        }
        if (iVar3 == 0) goto LAB_00163b47;
      }
LAB_00163aea:
      do {
        do {
          *pcVar9 = (char)uVar8;
          pcVar9 = pcVar9 + 1;
          uVar8 = (ulong)((byte *)input)[1];
          input = (char *)((byte *)input + 1);
        } while (0x3f < uVar8);
      } while ((0x8000800000000001U >> (uVar8 & 0x3f) & 1) == 0);
      *pcVar9 = '\0';
    }
LAB_00163b09:
  } while (input < pbVar10);
  goto LAB_00163b4a;
  while (pcVar7 = pcVar9 + -1, pcVar1 = pcVar9 + -1, pcVar9 = pcVar7, *pcVar1 != '/') {
LAB_00163b2d:
    if (pcVar9 <= pcVar6) break;
  }
LAB_00163b35:
  *pcVar9 = '/';
  pcVar7 = pcVar9 + 1;
LAB_00163b47:
  *pcVar7 = '\0';
LAB_00163b4a:
  *outp = pcVar6;
  return 0;
}

Assistant:

UNITTEST int dedotdotify(const char *input, size_t clen, char **outp)
{
  char *outptr;
  const char *endp = &input[clen];
  char *out;

  *outp = NULL;
  /* the path always starts with a slash, and a slash has not dot */
  if((clen < 2) || !memchr(input, '.', clen))
    return 0;

  out = malloc(clen + 1);
  if(!out)
    return 1; /* out of memory */

  *out = 0; /* null-terminates, for inputs like "./" */
  outptr = out;

  do {
    bool dotdot = TRUE;
    if(*input == '.') {
      /*  A. If the input buffer begins with a prefix of "../" or "./", then
          remove that prefix from the input buffer; otherwise, */

      if(!strncmp("./", input, 2)) {
        input += 2;
        clen -= 2;
      }
      else if(!strncmp("../", input, 3)) {
        input += 3;
        clen -= 3;
      }
      /*  D. if the input buffer consists only of "." or "..", then remove
          that from the input buffer; otherwise, */

      else if(!strcmp(".", input) || !strcmp("..", input) ||
              !strncmp(".?", input, 2) || !strncmp("..?", input, 3)) {
        *out = 0;
        break;
      }
      else
        dotdot = FALSE;
    }
    else if(*input == '/') {
      /*  B. if the input buffer begins with a prefix of "/./" or "/.", where
          "."  is a complete path segment, then replace that prefix with "/" in
          the input buffer; otherwise, */
      if(!strncmp("/./", input, 3)) {
        input += 2;
        clen -= 2;
      }
      else if(!strcmp("/.", input) || !strncmp("/.?", input, 3)) {
        *outptr++ = '/';
        *outptr = 0;
        break;
      }

      /*  C. if the input buffer begins with a prefix of "/../" or "/..",
          where ".." is a complete path segment, then replace that prefix with
          "/" in the input buffer and remove the last segment and its
          preceding "/" (if any) from the output buffer; otherwise, */

      else if(!strncmp("/../", input, 4)) {
        input += 3;
        clen -= 3;
        /* remove the last segment from the output buffer */
        while(outptr > out) {
          outptr--;
          if(*outptr == '/')
            break;
        }
        *outptr = 0; /* null-terminate where it stops */
      }
      else if(!strcmp("/..", input) || !strncmp("/..?", input, 4)) {
        /* remove the last segment from the output buffer */
        while(outptr > out) {
          outptr--;
          if(*outptr == '/')
            break;
        }
        *outptr++ = '/';
        *outptr = 0; /* null-terminate where it stops */
        break;
      }
      else
        dotdot = FALSE;
    }
    else
      dotdot = FALSE;

    if(!dotdot) {
      /*  E. move the first path segment in the input buffer to the end of
          the output buffer, including the initial "/" character (if any) and
          any subsequent characters up to, but not including, the next "/"
          character or the end of the input buffer. */

      do {
        *outptr++ = *input++;
        clen--;
      } while(*input && (*input != '/') && (*input != '?'));
      *outptr = 0;
    }

    /* continue until end of path */
  } while(input < endp);

  *outp = out;
  return 0; /* success */
}